

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9_hashmap_usort(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_hashmap *pMap_00;
  int iVar1;
  ProcNodeCmp local_40;
  ProcNodeCmp xCmp;
  jx9_value *pCallback;
  jx9_hashmap *pMap;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if ((0 < nArg) && (iVar1 = jx9_value_is_json_array(*apArg), iVar1 != 0)) {
    pMap_00 = (jx9_hashmap *)((*apArg)->x).pOther;
    if (1 < pMap_00->nEntry) {
      xCmp = (ProcNodeCmp)0x0;
      local_40 = HashmapCmpCallback4;
      if ((nArg < 2) || (iVar1 = jx9_value_is_callable(apArg[1]), iVar1 == 0)) {
        local_40 = HashmapCmpCallback1;
      }
      else {
        xCmp = (ProcNodeCmp)apArg[1];
      }
      HashmapMergeSort(pMap_00,local_40,xCmp);
      HashmapSortRehash(pMap_00);
    }
    jx9_result_bool(pCtx,1);
    return 0;
  }
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9_hashmap_usort(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_hashmap *pMap;
	/* Make sure we are dealing with a valid hashmap */
	if( nArg < 1 || !jx9_value_is_json_array(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the internal representation of the input hashmap */
	pMap = (jx9_hashmap *)apArg[0]->x.pOther;
	if( pMap->nEntry > 1 ){
		jx9_value *pCallback = 0;
		ProcNodeCmp xCmp;
		xCmp = HashmapCmpCallback4; /* User-defined function as the comparison callback */
		if( nArg > 1 && jx9_value_is_callable(apArg[1]) ){
			/* Point to the desired callback */
			pCallback = apArg[1];
		}else{
			/* Use the default comparison function */
			xCmp = HashmapCmpCallback1;
		}
		/* Do the merge sort */
		HashmapMergeSort(pMap, xCmp, pCallback);
		/* Rehash [Do not maintain index association as requested by the JX9 specification] */
		HashmapSortRehash(pMap);
	}
	/* All done, return TRUE */
	jx9_result_bool(pCtx, 1);
	return JX9_OK;
}